

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O2

void func_call_inline(size_t n)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  size_t sVar6;
  double dVar7;
  double dVar8;
  
  iVar5 = 0x10000001;
  lVar2 = std::chrono::_V2::system_clock::now();
  sVar1 = 0;
  do {
    sVar6 = sVar1;
    iVar5 = iVar5 + -1;
    sVar1 = n;
  } while (iVar5 != 0);
  lVar3 = std::chrono::_V2::system_clock::now();
  side_effect = side_effect + ((uint)sVar6 & 1);
  dVar7 = (double)(lVar3 - lVar2) / 1000000000.0;
  dVar8 = dVar7 * 1000.0 * 1000.0 * 1000.0 * 3.725290298461914e-09;
  expand_name("func_call_inline");
  poVar4 = std::operator<<((ostream *)&std::cout,expand_name::buf);
  std::operator<<(poVar4,": ");
  poVar4 = std::ostream::_M_insert<double>(dVar8);
  std::operator<<(poVar4,"ns per operation,\t");
  poVar4 = std::ostream::_M_insert<double>(dVar8 / unit);
  std::operator<<(poVar4," ticks,\t");
  poVar4 = std::ostream::_M_insert<double>(((268435456.0 / dVar7) / 1000.0) / 1000.0);
  poVar4 = std::operator<<(poVar4," Mrps");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

static void __attribute__((noinline))
func_call_inline(size_t n)
{
    size_t res = 0;
    now_t start = now();
    const size_t COUNT = 0x10000000;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        size_t x = f_inline(res, n);
        res += x;
    }
    now_t stop = now();
    side_effect += res % 2;


    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}